

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5BestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  sqlite3_index_constraint *psVar1;
  byte bVar2;
  uint uVar3;
  sqlite3_index_constraint *psVar4;
  sqlite3_index_constraint_usage *psVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  undefined8 *puVar11;
  undefined *puVar12;
  int *piVar13;
  long lVar14;
  bool bVar15;
  uint auStack_a8 [3];
  int local_9c;
  int local_98 [4];
  undefined4 local_88;
  int aColMap [3];
  
  auStack_a8[2] = *(uint *)&(pVTab[1].pModule)->xBestIndex;
  puVar11 = &DAT_00203580;
  piVar13 = local_98;
  for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(undefined8 *)piVar13 = *puVar11;
    puVar11 = puVar11 + 1;
    piVar13 = piVar13 + 2;
  }
  auStack_a8[1] = 0xffffffff;
  local_9c = auStack_a8[2] + 1;
  iVar8 = pInfo->nConstraint;
  if ((long)iVar8 < 1) {
    uVar10 = 0;
  }
  else {
    psVar4 = pInfo->aConstraint;
    lVar7 = 0;
    uVar10 = 0;
    do {
      psVar1 = psVar4 + lVar7;
      uVar3 = psVar1->iColumn;
      bVar2 = psVar1->op;
      if (((int)auStack_a8[2] < (int)uVar3 || ((int)uVar3 < 0 || bVar2 != 0x40)) &&
         (uVar3 != auStack_a8[2] || bVar2 != 2)) {
        bVar15 = true;
        if (bVar2 < 0x41) {
          lVar14 = 0x24;
          do {
            if (((uVar3 == auStack_a8[(long)*(int *)((long)auStack_a8 + lVar14 + 8) + 1]) &&
                ((*(uint *)((long)auStack_a8 + lVar14) & (uint)bVar2) != 0)) &&
               (psVar1->usable != '\0')) {
              *(int *)((long)local_98 + lVar14) = (int)lVar7;
              uVar10 = uVar10 | *(uint *)((long)auStack_a8 + lVar14 + 4);
            }
            lVar14 = lVar14 + 0x14;
          } while (lVar14 != 0x74);
        }
      }
      else if (psVar1->usable == '\0') {
        pInfo->estimatedCost = 1e+50;
        bVar15 = false;
      }
      else {
        uVar10 = uVar3 << 0x10 | uVar10 & 0xffff | 1;
        bVar15 = true;
        local_88 = (int)lVar7;
      }
      if (!bVar15) {
        return 0;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar8);
  }
  if (pInfo->nOrderBy == 1) {
    iVar8 = pInfo->aOrderBy->iColumn;
    uVar3 = uVar10 | 0x40;
    if (iVar8 != -1) {
      uVar3 = uVar10;
    }
    uVar6 = uVar10 | 0x20;
    if ((uVar10 & 1) == 0) {
      uVar6 = uVar3;
    }
    if (iVar8 != auStack_a8[2] + 1) {
      uVar6 = uVar3;
    }
    uVar10 = uVar6;
    if ((uVar6 & 0x60) != 0) {
      pInfo->orderByConsumed = 1;
      if (pInfo->aOrderBy->desc != '\0') {
        uVar10 = uVar6 | 0x80;
      }
    }
  }
  if ((uVar10 & 4) == 0) {
    if ((uVar10 & 0x18) == 0) {
      uVar9 = (ulong)((uVar10 & 1) == 0);
      puVar12 = &DAT_00206630;
    }
    else if ((uVar10 & 0x18) == 0x18) {
      uVar9 = (ulong)((uVar10 & 1) == 0);
      puVar12 = &DAT_00206640;
    }
    else {
      uVar9 = (ulong)((uVar10 & 1) == 0);
      puVar12 = &DAT_00206650;
    }
    pInfo->estimatedCost = *(double *)(puVar12 + uVar9 * 8);
  }
  else {
    bVar15 = (uVar10 & 1) == 0;
    pInfo->estimatedCost = *(double *)(&DAT_00206620 + (ulong)bVar15 * 8);
    if (bVar15) {
      *(byte *)&pInfo->idxFlags = (byte)pInfo->idxFlags | 1;
    }
  }
  iVar8 = 1;
  lVar7 = 0x10;
  do {
    lVar14 = (long)*(int *)((long)local_98 + lVar7);
    if (-1 < lVar14) {
      psVar5 = pInfo->aConstraintUsage;
      psVar5[lVar14].argvIndex = iVar8;
      iVar8 = iVar8 + 1;
      psVar5[lVar14].omit = *(uchar *)((long)local_98 + lVar7 + -4);
    }
    lVar7 = lVar7 + 0x14;
  } while (lVar7 != 0x74);
  pInfo->idxNum = uVar10;
  return 0;
}

Assistant:

static int fts5BestIndexMethod(sqlite3_vtab *pVTab, sqlite3_index_info *pInfo){
  Fts5Table *pTab = (Fts5Table*)pVTab;
  Fts5Config *pConfig = pTab->pConfig;
  const int nCol = pConfig->nCol;
  int idxFlags = 0;               /* Parameter passed through to xFilter() */
  int bHasMatch;
  int iNext;
  int i;

  struct Constraint {
    int op;                       /* Mask against sqlite3_index_constraint.op */
    int fts5op;                   /* FTS5 mask for idxFlags */
    int iCol;                     /* 0==rowid, 1==tbl, 2==rank */
    int omit;                     /* True to omit this if found */
    int iConsIndex;               /* Index in pInfo->aConstraint[] */
  } aConstraint[] = {
    {SQLITE_INDEX_CONSTRAINT_MATCH|SQLITE_INDEX_CONSTRAINT_EQ, 
                                    FTS5_BI_MATCH,    1, 1, -1},
    {SQLITE_INDEX_CONSTRAINT_MATCH|SQLITE_INDEX_CONSTRAINT_EQ, 
                                    FTS5_BI_RANK,     2, 1, -1},
    {SQLITE_INDEX_CONSTRAINT_EQ,    FTS5_BI_ROWID_EQ, 0, 0, -1},
    {SQLITE_INDEX_CONSTRAINT_LT|SQLITE_INDEX_CONSTRAINT_LE, 
                                    FTS5_BI_ROWID_LE, 0, 0, -1},
    {SQLITE_INDEX_CONSTRAINT_GT|SQLITE_INDEX_CONSTRAINT_GE, 
                                    FTS5_BI_ROWID_GE, 0, 0, -1},
  };

  int aColMap[3];
  aColMap[0] = -1;
  aColMap[1] = nCol;
  aColMap[2] = nCol+1;

  assert( SQLITE_INDEX_CONSTRAINT_EQ<SQLITE_INDEX_CONSTRAINT_MATCH );
  assert( SQLITE_INDEX_CONSTRAINT_GT<SQLITE_INDEX_CONSTRAINT_MATCH );
  assert( SQLITE_INDEX_CONSTRAINT_LE<SQLITE_INDEX_CONSTRAINT_MATCH );
  assert( SQLITE_INDEX_CONSTRAINT_GE<SQLITE_INDEX_CONSTRAINT_MATCH );
  assert( SQLITE_INDEX_CONSTRAINT_LE<SQLITE_INDEX_CONSTRAINT_MATCH );

  /* Set idxFlags flags for all WHERE clause terms that will be used. */
  for(i=0; i<pInfo->nConstraint; i++){
    struct sqlite3_index_constraint *p = &pInfo->aConstraint[i];
    int iCol = p->iColumn;

    if( (p->op==SQLITE_INDEX_CONSTRAINT_MATCH && iCol>=0 && iCol<=nCol)
     || (p->op==SQLITE_INDEX_CONSTRAINT_EQ && iCol==nCol)
    ){
      /* A MATCH operator or equivalent */
      if( p->usable ){
        idxFlags = (idxFlags & 0xFFFF) | FTS5_BI_MATCH | (iCol << 16);
        aConstraint[0].iConsIndex = i;
      }else{
        /* As there exists an unusable MATCH constraint this is an 
        ** unusable plan. Set a prohibitively high cost. */
        pInfo->estimatedCost = 1e50;
        return SQLITE_OK;
      }
    }else if( p->op<=SQLITE_INDEX_CONSTRAINT_MATCH ){
      int j;
      for(j=1; j<ArraySize(aConstraint); j++){
        struct Constraint *pC = &aConstraint[j];
        if( iCol==aColMap[pC->iCol] && (p->op & pC->op) && p->usable ){
          pC->iConsIndex = i;
          idxFlags |= pC->fts5op;
        }
      }
    }
  }

  /* Set idxFlags flags for the ORDER BY clause */
  if( pInfo->nOrderBy==1 ){
    int iSort = pInfo->aOrderBy[0].iColumn;
    if( iSort==(pConfig->nCol+1) && BitFlagTest(idxFlags, FTS5_BI_MATCH) ){
      idxFlags |= FTS5_BI_ORDER_RANK;
    }else if( iSort==-1 ){
      idxFlags |= FTS5_BI_ORDER_ROWID;
    }
    if( BitFlagTest(idxFlags, FTS5_BI_ORDER_RANK|FTS5_BI_ORDER_ROWID) ){
      pInfo->orderByConsumed = 1;
      if( pInfo->aOrderBy[0].desc ){
        idxFlags |= FTS5_BI_ORDER_DESC;
      }
    }
  }

  /* Calculate the estimated cost based on the flags set in idxFlags. */
  bHasMatch = BitFlagTest(idxFlags, FTS5_BI_MATCH);
  if( BitFlagTest(idxFlags, FTS5_BI_ROWID_EQ) ){
    pInfo->estimatedCost = bHasMatch ? 100.0 : 10.0;
    if( bHasMatch==0 ) fts5SetUniqueFlag(pInfo);
  }else if( BitFlagAllTest(idxFlags, FTS5_BI_ROWID_LE|FTS5_BI_ROWID_GE) ){
    pInfo->estimatedCost = bHasMatch ? 500.0 : 250000.0;
  }else if( BitFlagTest(idxFlags, FTS5_BI_ROWID_LE|FTS5_BI_ROWID_GE) ){
    pInfo->estimatedCost = bHasMatch ? 750.0 : 750000.0;
  }else{
    pInfo->estimatedCost = bHasMatch ? 1000.0 : 1000000.0;
  }

  /* Assign argvIndex values to each constraint in use. */
  iNext = 1;
  for(i=0; i<ArraySize(aConstraint); i++){
    struct Constraint *pC = &aConstraint[i];
    if( pC->iConsIndex>=0 ){
      pInfo->aConstraintUsage[pC->iConsIndex].argvIndex = iNext++;
      pInfo->aConstraintUsage[pC->iConsIndex].omit = (unsigned char)pC->omit;
    }
  }

  pInfo->idxNum = idxFlags;
  return SQLITE_OK;
}